

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::VectorDCE::RewriteInsertInstruction
          (VectorDCE *this,Instruction *current_inst,BitVector *live_components,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *dead_dbg_value)

{
  IRContext *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t before;
  initializer_list<unsigned_int> init_list;
  uint32_t local_6c;
  BitVector temp;
  SmallVector<unsigned_int,_2UL> local_50;
  
  uVar3 = Instruction::NumInOperands(current_inst);
  if (uVar3 == 2) {
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    uVar3 = Instruction::result_id(current_inst);
    IRContext::KillNamesAndDecorates(pIVar1,uVar3);
    uVar3 = 0;
  }
  else {
    uVar3 = Instruction::GetSingleWordInOperand(current_inst,2);
    bVar2 = utils::BitVector::Get(live_components,uVar3);
    if (bVar2) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&temp.bits_,&live_components->bits_);
      utils::BitVector::Clear(&temp,uVar3);
      bVar2 = utils::BitVector::Empty(&temp);
      if (bVar2) {
        IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,current_inst);
        uVar3 = Instruction::type_id(current_inst);
        local_6c = MemPass::Type2Undef(&this->super_MemPass,uVar3);
        init_list._M_len = 1;
        init_list._M_array = &local_6c;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_50,init_list);
        Instruction::SetInOperand(current_inst,1,&local_50);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_50);
        IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,current_inst);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&temp);
      return bVar2;
    }
    MarkDebugValueUsesAsDead(this,current_inst,dead_dbg_value);
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    uVar3 = Instruction::result_id(current_inst);
    IRContext::KillNamesAndDecorates(pIVar1,uVar3);
    uVar3 = 1;
  }
  uVar3 = Instruction::GetSingleWordInOperand(current_inst,uVar3);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  before = Instruction::result_id(current_inst);
  IRContext::ReplaceAllUsesWith(pIVar1,before,uVar3);
  return true;
}

Assistant:

bool VectorDCE::RewriteInsertInstruction(
    Instruction* current_inst, const utils::BitVector& live_components,
    std::vector<Instruction*>* dead_dbg_value) {
  // If the value being inserted is not live, then we can skip the insert.

  if (current_inst->NumInOperands() == 2) {
    // If there are no indices, then this is the same as a copy.
    context()->KillNamesAndDecorates(current_inst->result_id());
    uint32_t object_id =
        current_inst->GetSingleWordInOperand(kInsertObjectIdInIdx);
    context()->ReplaceAllUsesWith(current_inst->result_id(), object_id);
    return true;
  }

  uint32_t insert_index = current_inst->GetSingleWordInOperand(2);
  if (!live_components.Get(insert_index)) {
    MarkDebugValueUsesAsDead(current_inst, dead_dbg_value);
    context()->KillNamesAndDecorates(current_inst->result_id());
    uint32_t composite_id =
        current_inst->GetSingleWordInOperand(kInsertCompositeIdInIdx);
    context()->ReplaceAllUsesWith(current_inst->result_id(), composite_id);
    return true;
  }

  // If the values already in the composite are not used, then replace it with
  // an undef.
  utils::BitVector temp = live_components;
  temp.Clear(insert_index);
  if (temp.Empty()) {
    context()->ForgetUses(current_inst);
    uint32_t undef_id = Type2Undef(current_inst->type_id());
    current_inst->SetInOperand(kInsertCompositeIdInIdx, {undef_id});
    context()->AnalyzeUses(current_inst);
    return true;
  }

  return false;
}